

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  long lVar1;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_58;
  string comment;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (messenger != (cmMessenger *)0x0) {
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[33]>
                (&comment,(char (*) [10])0x69396f,key,
                 (char (*) [33])" contained a newline; truncating");
      local_58.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_58.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_58);
      cmMessenger::IssueMessage(messenger,WARNING,&comment,(cmListFileBacktrace *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&comment);
    }
    cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[56]>
              (&comment,(char (*) [19])"WARNING: Value of ",key,
               (char (*) [56])" contained a newline and was truncated. Original value:");
    OutputWarningComment(fout,&comment,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)&comment);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}